

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

ostream * nivalis::operator<<(ostream *os,ASTNode *node)

{
  bool bVar1;
  ostream *poVar2;
  uint *in_RSI;
  ostream *in_RDI;
  
  std::ostream::operator<<(in_RDI,*in_RSI);
  if (*in_RSI == 1) {
    poVar2 = std::operator<<(in_RDI,"#");
    std::ostream::operator<<(poVar2,*(double *)(in_RSI + 2));
  }
  bVar1 = OpCode::has_ref(*in_RSI);
  if (bVar1) {
    poVar2 = std::operator<<(in_RDI,"&");
    std::ostream::operator<<(poVar2,*(ulong *)(in_RSI + 2));
  }
  return in_RDI;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Expr::ASTNode& node) {
    os << node.opcode;
    if (node.opcode == OpCode::val) os << "#" << node.val;
    if (OpCode::has_ref(node.opcode)) os << "&" << node.ref;
    return os;
}